

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

int Cba_NtkCheckComboLoop(Cba_Ntk_t *p)

{
  int iVar1;
  int local_1c;
  int iObj;
  Cba_Ntk_t *p_local;
  
  Cba_NtkCleanObjCopies(p);
  local_1c = 1;
  while( true ) {
    iVar1 = Vec_StrSize(&p->vObjType);
    if (iVar1 <= local_1c) {
      return 1;
    }
    iVar1 = Cba_ObjIsBox(p,local_1c);
    if (((iVar1 != 0) && (iVar1 = Cba_ObjIsSeq(p,local_1c), iVar1 == 0)) &&
       (iVar1 = Cba_NtkCheckComboLoop_rec(p,local_1c), iVar1 == 0)) break;
    local_1c = local_1c + 1;
  }
  printf("Cyclic dependency of user boxes is detected.\n");
  return 0;
}

Assistant:

int Cba_NtkCheckComboLoop( Cba_Ntk_t * p )
{
    int iObj;
    Cba_NtkCleanObjCopies( p ); // -1 = not visited; 0 = on the path; 1 = finished
    Cba_NtkForEachBox( p, iObj )
        if ( !Cba_ObjIsSeq(p, iObj) )
            if ( !Cba_NtkCheckComboLoop_rec( p, iObj ) )
            {
                printf( "Cyclic dependency of user boxes is detected.\n" );
                return 0;
            }
    return 1;
}